

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O3

void avaluem(double *w,int N,int p,int q,double *phi,double *theta,int tval,double *a)

{
  int iVar1;
  void *__s;
  void *__s_00;
  long lVar2;
  void *__s_01;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  int iVar8;
  long lVar9;
  void *pvVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  double *pdVar15;
  double *pdVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  double dVar20;
  
  __s = malloc((long)N * 8);
  __s_00 = malloc((long)tval << 3);
  uVar17 = q;
  if (q < p) {
    uVar17 = p;
  }
  iVar1 = tval + N;
  iVar18 = iVar1 + uVar17;
  lVar2 = (long)iVar18;
  __s_01 = malloc(lVar2 * 8);
  if (0 < N) {
    memset(__s,0,(ulong)(uint)N << 3);
  }
  if (0 < iVar18) {
    memset(__s_01,0,(ulong)(iVar18 - 1) * 8 + 8);
  }
  if (1 < iVar1) {
    memset(a,0,(ulong)(iVar1 - 1) << 3);
  }
  if (0 < tval) {
    memset(__s_00,0,(ulong)(uint)tval * 8);
  }
  uVar3 = (ulong)(uint)p;
  uVar4 = (ulong)(uint)q;
  if (-1 < (int)(~uVar17 + N)) {
    uVar14 = (ulong)(~uVar17 + N);
    pdVar7 = w + uVar14 + 1;
    lVar9 = (long)__s + uVar14 * 8 + 8;
    do {
      if (p < 1) {
        dVar20 = 0.0;
      }
      else {
        dVar20 = 0.0;
        uVar11 = 0;
        do {
          dVar20 = dVar20 - phi[uVar11] * pdVar7[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar3 != uVar11);
      }
      if (0 < q) {
        uVar11 = 0;
        do {
          dVar20 = dVar20 + theta[uVar11] * *(double *)(lVar9 + uVar11 * 8);
          uVar11 = uVar11 + 1;
        } while (uVar4 != uVar11);
      }
      *(double *)((long)__s + uVar14 * 8) = dVar20 + w[uVar14];
      pdVar7 = pdVar7 + -1;
      lVar9 = lVar9 + -8;
      iVar18 = (int)uVar14;
      uVar14 = uVar14 - 1;
    } while (0 < iVar18);
  }
  if (0 < tval) {
    pdVar5 = (double *)((long)__s_00 + -8);
    lVar9 = 0;
    uVar14 = 0;
    pvVar10 = __s;
    pdVar7 = w;
    do {
      if (p < 1) {
        dVar20 = 0.0;
      }
      else {
        dVar20 = 0.0;
        uVar11 = 0;
        pdVar15 = pdVar5;
        pdVar16 = pdVar7;
        do {
          pdVar6 = pdVar16;
          if ((long)(lVar9 + uVar11) < 0) {
            pdVar6 = pdVar15;
          }
          dVar20 = dVar20 - phi[uVar11] * *pdVar6;
          uVar11 = uVar11 + 1;
          pdVar16 = pdVar16 + 1;
          pdVar15 = pdVar15 + -1;
        } while (uVar3 != uVar11);
      }
      if (0 < q) {
        uVar11 = 0;
        do {
          if (-1 < (long)(lVar9 + uVar11)) {
            dVar20 = dVar20 + theta[uVar11] * *(double *)((long)pvVar10 + uVar11 * 8);
          }
          uVar11 = uVar11 + 1;
        } while (uVar4 != uVar11);
      }
      *(double *)((long)__s_00 + uVar14 * 8) = -dVar20;
      uVar14 = uVar14 + 1;
      pdVar7 = pdVar7 + -1;
      lVar9 = lVar9 + -1;
      pdVar5 = pdVar5 + 1;
      pvVar10 = (void *)((long)pvVar10 + -8);
    } while (uVar14 != (uint)tval);
  }
  if (0 < iVar1) {
    iVar8 = uVar17 + tval;
    iVar18 = p;
    if (p < q) {
      iVar18 = q;
    }
    lVar9 = (long)iVar18;
    iVar12 = iVar8 - iVar18;
    iVar18 = iVar18 + -1;
    do {
      if (p < 1) {
        dVar20 = 0.0;
      }
      else {
        dVar20 = 0.0;
        lVar19 = 0;
        iVar13 = iVar18;
        do {
          if (iVar13 < iVar8) {
            if ((int)uVar17 <= iVar13) {
              pdVar7 = (double *)((long)__s_00 + lVar19 + (long)iVar12 * 8);
              goto LAB_00146562;
            }
          }
          else {
            pdVar7 = w + (iVar13 - iVar8);
LAB_00146562:
            dVar20 = dVar20 - *(double *)((long)phi + lVar19) * *pdVar7;
          }
          lVar19 = lVar19 + 8;
          iVar13 = iVar13 + -1;
        } while (uVar3 << 3 != lVar19);
      }
      if (0 < q) {
        uVar14 = 0;
        iVar13 = iVar18;
        do {
          if ((int)uVar17 <= iVar13) {
            dVar20 = dVar20 + theta[uVar14] * *(double *)((long)__s_01 + (long)iVar13 * 8);
          }
          uVar14 = uVar14 + 1;
          iVar13 = iVar13 + -1;
        } while (uVar4 != uVar14);
      }
      if (lVar9 < iVar8) {
        if ((int)uVar17 <= lVar9) {
          iVar13 = iVar8 - (int)lVar9;
          pdVar7 = (double *)((long)__s_00 + -8);
          goto LAB_001465d8;
        }
      }
      else {
        iVar13 = (int)lVar9 - iVar8;
        pdVar7 = w;
LAB_001465d8:
        *(double *)((long)__s_01 + lVar9 * 8) = dVar20 + pdVar7[iVar13];
      }
      lVar9 = lVar9 + 1;
      iVar12 = iVar12 + -1;
      iVar18 = iVar18 + 1;
    } while (lVar9 < lVar2);
    if (1 < iVar1) {
      lVar9 = 0;
      do {
        a[(int)lVar9] = *(double *)((long)__s_01 + lVar9 * 8 + (long)(int)(uVar17 + 1) * 8);
        lVar19 = (int)(uVar17 + 1) + lVar9;
        lVar9 = lVar9 + 1;
      } while (lVar19 + 1 < lVar2);
    }
  }
  free(__s);
  free(__s_00);
  free(__s_01);
  return;
}

Assistant:

void avaluem(double *w,int N,int p, int q, double *phi,double *theta,int tval,double *a) {
	int k,i,t,t2,newl,iter;
	double temp;
	double *e,*w2,*alpha;


	e = (double*) malloc(sizeof(double) * N);
	w2 = (double*) malloc(sizeof(double) * tval);

	if (p > q) {
		k = p;
	} else {
		k = q;
	}

	alpha = (double*) malloc(sizeof(double) * (tval+N+k));


	for(i = 0; i < N;++i) {
		e[i] = 0.0;
	}

	for(i = 0; i < N+tval+k;++i) {
		alpha[i] = 0.0;
	}

	for(i = 0; i < N+tval-1;++i) {
		a[i] = 0.0;
	}

	for(i = 0; i < tval;++i) {
		w2[i] = 0.0;
	}

	for(i = N-k-1; i >= 0; --i) {
		temp = 0.0;

		for (t = 0; t < p;++t) {
			temp = temp - phi[t] * w[i+t+1];
		}

		for ( t2 = 0; t2 < q;++t2) {
			temp = temp + theta[t2] * e[t2+i+1];
		}

		e[i] = w[i] + temp;
	}
/*
	for(i = 0; i < N;++i) {
		printf("%g \n",e[i]);
	}
*/

	for(i = 0; i < tval;++i) {
		temp = 0.0;
		for(t = 0; t < p;++t) {
			if (t-i < 0) {
				temp = temp - phi[t]*w2[i-t-1];
			} else {
				temp = temp - phi[t]*w[t-i];
			}
			//printf("temp %g \n",temp);

		}

		for(t2 = 0; t2 < q;++t2) {
			if (t2-i >= 0) {
				temp=temp+theta[t2]*e[t2-i];
			}
		}
		w2[i] = -temp;
	}
/*
	for(i = 0; i < tval;++i) {
		printf("%g \n",w2[i]);
	}
*/


	newl = N + tval;
	

	for (iter = k; iter < newl+k;iter++) {
		temp = 0.0;
		for (t = 0; t < p;++t) {
			if (iter-t-1 >= tval+k ) {
				temp = temp - phi[t] * w[iter-t-1-tval-k];
			} else if (iter-t-1 < tval+k && iter-t-1 >= k) {
				temp = temp - phi[t] * w2[k-iter+tval+t];
			}
		}
		
		for (t2 = 0; t2 < q; ++t2) {
			if (iter-t2-1 >= k ) {
				temp = temp + theta[t2] * alpha[iter-t2-1];
			}
		}

		//printf("%g \n",temp);

		if (iter >= tval+k) {
			alpha[iter] = w[iter-tval-k] + temp;
		} else if (iter >= k){
			alpha[iter] = w2[k-iter+tval-1] + temp;
		}
	}

	for (iter = k+1; iter < newl+k;iter++) {
		a[iter-k-1] = alpha[iter];
	}

	free(e);
	free(w2);
	free(alpha);
}